

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  float fVar13;
  undefined8 in_XMM1_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  fVar13 = half_sz.x;
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = pos;
  local_18 = (ImVec2)vmovlps_avx(auVar12._0_16_);
  fVar2 = (float)in_XMM1_Qb;
  fVar3 = (float)((ulong)in_XMM1_Qb >> 0x20);
  fVar1 = half_sz.y;
  local_10.x = local_18.x;
  fVar7 = local_18.y;
  switch(direction) {
  case 0:
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_18.x;
    auVar8._4_4_ = local_18.y;
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = half_sz;
    auVar15 = vsubps_avx(auVar8,auVar6);
    auVar9._0_4_ = local_10.x + fVar13;
    auVar9._4_4_ = fVar7 + fVar1;
    auVar9._8_4_ = fVar2 + 0.0;
    auVar9._12_4_ = fVar3 + 0.0;
    break;
  case 1:
    auVar11._8_8_ = 0;
    auVar11._0_4_ = local_18.x;
    auVar11._4_4_ = local_18.y;
    auVar15._0_4_ = local_10.x + fVar13;
    auVar15._4_4_ = fVar7 + fVar1;
    auVar15._8_4_ = fVar2 + 0.0;
    auVar15._12_4_ = fVar3 + 0.0;
    auVar5._8_8_ = in_XMM1_Qb;
    auVar5._0_8_ = half_sz;
    auVar9 = vsubps_avx(auVar11,auVar5);
    break;
  case 2:
    auVar14._0_4_ = local_10.x + fVar13;
    auVar14._4_4_ = fVar7 + fVar1;
    auVar14._8_4_ = fVar2 + 0.0;
    auVar14._12_4_ = fVar3 + 0.0;
    local_8 = (ImVec2)vmovlps_avx(auVar14);
    local_10.x = local_10.x - fVar13;
    goto LAB_00193c4b;
  case 3:
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_18.x;
    auVar10._4_4_ = local_18.y;
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = half_sz;
    auVar14 = vsubps_avx(auVar10,auVar4);
    local_8 = (ImVec2)vmovlps_avx(auVar14);
    local_10.x = local_10.x + fVar13;
LAB_00193c4b:
    local_10.y = (float)vextractps_avx(auVar14,1);
    goto LAB_00193c85;
  default:
    goto switchD_00193c06_default;
  }
  local_8.y = (float)vextractps_avx(auVar15,1);
  local_8.x = auVar9._0_4_;
  local_10 = (ImVec2)vmovlps_avx(auVar9);
LAB_00193c85:
  ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
switchD_00193c06_default:
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}